

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

void Blindf_off(obj *otmp,boolean deliberate)

{
  bool bVar1;
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00184ed4;
    bVar1 = true;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00184ecf;
  }
  else {
LAB_00184ecf:
    if (ublindf == (obj *)0x0) {
      bVar1 = false;
    }
    else {
LAB_00184ed4:
      bVar1 = ublindf->oartifact == '\x1d';
    }
  }
  violated(4);
  takeoff_mask = takeoff_mask & 0xfff7ffff;
  setworn((obj *)0x0,(long)otmp->owornmask);
  off_msg(otmp,deliberate);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00184f44;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00184f3f;
LAB_00184f95:
    if (bVar1) {
      return;
    }
    pline("You can see again.");
  }
  else {
LAB_00184f3f:
    if (ublindf != (obj *)0x0) {
LAB_00184f44:
      if (ublindf->oartifact == '\x1d') goto LAB_00184f95;
    }
    if (!bVar1) {
      if (otmp->otyp == 0xed) {
        return;
      }
      pline("You still cannot see.");
      return;
    }
    pline("You can\'t see anything now!");
    if (uball != (obj *)0x0) {
      set_bc(0);
    }
  }
  if ((((((youmonst.data == mons + 0x32 ||
          (youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e)) ||
         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) &&
         u.uprops[0x19].blocked == 0) || (u.uprops[0x40].intrinsic != 0)) ||
      (u.uprops[0x40].extrinsic != 0)) || (((youmonst.data)->mflags3 & 0x100) != 0)) {
    see_monsters();
  }
  vision_full_recalc = '\x01';
  iflags.botl = '\x01';
  return;
}

Assistant:

void Blindf_off(struct obj *otmp, boolean deliberate)
{
	boolean was_blind = Blind, changed = FALSE;

	violated(CONDUCT_BLINDFOLDED);
	takeoff_mask &= ~W_TOOL;
	setworn(NULL, otmp->owornmask);
	off_msg(otmp, deliberate);

	if (Blind) {
	    if (was_blind) {
		/* "still cannot see" makes no sense when removing lenses
		   since they can't have been the cause of your blindness */
		if (otmp->otyp != LENSES)
		    pline("You still cannot see.");
	    } else {
		changed = TRUE;	/* !was_blind */
		/* "You were wearing the Eyes of the Overworld." */
		pline("You can't see anything now!");
		/* set ball&chain variables before the hero goes blind */
		if (Punished) set_bc(0);
	    }
	} else if (was_blind) {
	    changed = TRUE;	/* !Blind */
	    pline("You can see again.");
	}
	if (changed) {
	    /* blindness has just been toggled */
	    if (Blind_telepat || Infravision) see_monsters();
	    vision_full_recalc = 1;	/* recalc vision limits */
	    iflags.botl = 1;
	}
}